

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Date.cpp
# Opt level: O1

Date asl::Date::now(void)

{
  double *in_RDI;
  Date DVar1;
  
  DVar1._t = asl::now();
  *in_RDI = DVar1._t;
  return (Date)DVar1._t;
}

Assistant:

Date Date::now()
{
#ifdef _WIN32
	FILETIME t;
	GetSystemTimeAsFileTime(&t);
	return Date(ft2t(t));
#else
	// return Date(::time(0));
	return Date(asl::now());
#endif
}